

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyperGraph.h
# Opt level: O2

void __thiscall HyperGraph::build_one_RRset(HyperGraph *this,uint32_t uStart,size_t hyperIdx)

{
  int iVar1;
  vector<bool,_std::allocator<bool>_> *this_00;
  uint uVar2;
  pointer pvVar3;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  pair<unsigned_int,_float> *nbr;
  pointer ppVar7;
  ulong uVar8;
  int i;
  ulong uVar9;
  reference rVar10;
  allocator_type local_59;
  size_t hyperIdx_local;
  pointer local_50;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  hyperIdx_local = hyperIdx;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((this->_FRsets).
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + uStart,&hyperIdx_local);
  *(this->__vecVisitNode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = uStart;
  this_00 = &this->__vecVisitBool;
  rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,(ulong)uStart);
  *rVar10._M_p = *rVar10._M_p | rVar10._M_mask;
  uVar6 = 1;
  uVar9 = 0;
LAB_001160ab:
LAB_001160b9:
  if (uVar9 < uVar6) {
    uVar2 = (this->__vecVisitNode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar9];
    if (this->_cascadeModel == LT) {
      pvVar3 = (this->_graph->
               super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar3[uVar2].
                   super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                   ._M_impl.super__Vector_impl_data + 8) !=
          pvVar3[uVar2].
          super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        sVar5 = gen_random_node_by_weight_LT(pvVar3 + uVar2);
        pvVar3 = (this->_graph->
                 super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar4 = *(long *)&pvVar3[uVar2].
                          super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                          ._M_impl.super__Vector_impl_data;
        if (sVar5 < (ulong)((long)*(pointer *)
                                   ((long)&pvVar3[uVar2].
                                           super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                           ._M_impl.super__Vector_impl_data + 8) - lVar4 >> 3)) {
          uVar2 = *(uint *)(lVar4 + sVar5 * 8);
          uVar8 = (ulong)uVar2;
          rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,uVar8);
          if ((*rVar10._M_p & rVar10._M_mask) != 0) goto LAB_00116211;
          (this->__vecVisitNode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar6] = uVar2;
          uVar6 = uVar6 + 1;
          rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,uVar8);
          *rVar10._M_p = *rVar10._M_p | rVar10._M_mask;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    ((this->_FRsets).
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar8,&hyperIdx_local);
          goto LAB_00116209;
        }
        goto LAB_00116211;
      }
    }
    else if (this->_cascadeModel == IC) goto LAB_001160ec;
    uVar9 = uVar9 + 1;
    goto LAB_001160b9;
  }
LAB_00116211:
  for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
    rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (this_00,(ulong)(this->__vecVisitNode).
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar9]);
    *rVar10._M_p = *rVar10._M_p & ~rVar10._M_mask;
  }
  __first._M_current =
       (this->__vecVisitNode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_start;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::
  vector<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_48,__first,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )(__first._M_current + uVar6),&local_59);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&this->_RRsets,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  return;
LAB_001160ec:
  pvVar3 = (this->_graph->
           super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_50 = *(pointer *)
              ((long)&pvVar3[uVar2].
                      super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                      ._M_impl.super__Vector_impl_data + 8);
  for (ppVar7 = pvVar3[uVar2].
                super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar7 != local_50; ppVar7 = ppVar7 + 1)
  {
    uVar2 = ppVar7->first;
    uVar8 = (ulong)uVar2;
    rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,uVar8);
    if ((*rVar10._M_p & rVar10._M_mask) == 0) {
      if (0x17d < dsfmt_global_data.idx) {
        dsfmt_gen_rand_all(&dsfmt_global_data);
        dsfmt_global_data.idx = 0;
      }
      iVar1 = dsfmt_global_data.idx + 1;
      lVar4 = (long)dsfmt_global_data.idx;
      dsfmt_global_data.idx = iVar1;
      if (2.0 - dsfmt_global_data.status[0].d[lVar4] <= (double)ppVar7->second) {
        (this->__vecVisitNode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar6] = uVar2;
        uVar6 = uVar6 + 1;
        rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,uVar8);
        *rVar10._M_p = *rVar10._M_p | rVar10._M_mask;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((this->_FRsets).
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar8,&hyperIdx_local);
      }
    }
  }
LAB_00116209:
  uVar9 = uVar9 + 1;
  goto LAB_001160ab;
}

Assistant:

void build_one_RRset(const uint32_t uStart, const size_t hyperIdx)
    {
        size_t numVisitNode = 0, currIdx = 0;
        _FRsets[uStart].push_back(hyperIdx);
        __vecVisitNode[numVisitNode++] = uStart;
        __vecVisitBool[uStart] = true;
        while (currIdx < numVisitNode)
        {
            const auto expand = __vecVisitNode[currIdx++];
            if (_cascadeModel == IC)
            {
                for (auto& nbr : _graph[expand])
                {
                    const auto nbrId = nbr.first;
                    if (__vecVisitBool[nbrId])
                        continue;
                    const auto randDouble = dsfmt_gv_genrand_open_close();
                    if (randDouble > nbr.second)
                        continue;
                    __vecVisitNode[numVisitNode++] = nbrId;
                    __vecVisitBool[nbrId] = true;
                    _FRsets[nbrId].push_back(hyperIdx);
                }
            }
            else if (_cascadeModel == LT)
            {
                if (_graph[expand].size() == 0)
                    continue;
                const auto nextNbrIdx = gen_random_node_by_weight_LT(_graph[expand]);
                if (nextNbrIdx >= _graph[expand].size()) break; // No element activated
                const auto nbrId = _graph[expand][nextNbrIdx].first;
                if (__vecVisitBool[nbrId]) break; // Stop, no further node activated
                __vecVisitNode[numVisitNode++] = nbrId;
                __vecVisitBool[nbrId] = true;
                _FRsets[nbrId].push_back(hyperIdx);
            }
        }
        for (int i = 0; i < numVisitNode; i++) __vecVisitBool[__vecVisitNode[i]] = false;
        _RRsets.push_back(RRset(__vecVisitNode.begin(), __vecVisitNode.begin() + numVisitNode));
    }